

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

type * __thiscall
duckdb::Deserializer::
Read<duckdb::vector<duckdb::unique_ptr<duckdb::Complex,std::default_delete<duckdb::Complex>,true>,true>>
          (type *__return_storage_ptr__,Deserializer *this)

{
  pointer pcVar1;
  __uniq_ptr_impl<duckdb::Complex,_std::default_delete<duckdb::Complex>_> _Var2;
  pointer pCVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  __uniq_ptr_impl<duckdb::Complex,_std::default_delete<duckdb::Complex>_> local_40;
  pointer local_38;
  
  (__return_storage_ptr__->
  super_vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = (*this->_vptr_Deserializer[8])(this);
  lVar5 = CONCAT44(extraout_var,iVar4);
  if (lVar5 != 0) {
    do {
      local_40._M_t.super__Tuple_impl<0UL,_duckdb::Complex_*,_std::default_delete<duckdb::Complex>_>
      .super__Head_base<0UL,_duckdb::Complex_*,_false>._M_head_impl =
           (tuple<duckdb::Complex_*,_std::default_delete<duckdb::Complex>_>)
           (_Tuple_impl<0UL,_duckdb::Complex_*,_std::default_delete<duckdb::Complex>_>)0x0;
      iVar4 = (*this->_vptr_Deserializer[10])(this);
      if ((char)iVar4 != '\0') {
        (*this->_vptr_Deserializer[6])(this);
        Complex::Deserialize((Complex *)&local_38,this);
        pCVar3 = local_38;
        local_38 = (pointer)0x0;
        std::__uniq_ptr_impl<duckdb::Complex,_std::default_delete<duckdb::Complex>_>::reset
                  (&local_40,pCVar3);
        pCVar3 = local_38;
        if (local_38 != (pointer)0x0) {
          pcVar1 = (local_38->c2)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != &(local_38->c2).field_2) {
            operator_delete(pcVar1);
          }
          operator_delete(pCVar3);
        }
        (*this->_vptr_Deserializer[7])(this);
      }
      (*this->_vptr_Deserializer[0xb])(this);
      std::
      vector<duckdb::unique_ptr<duckdb::Complex,std::default_delete<duckdb::Complex>,true>,std::allocator<duckdb::unique_ptr<duckdb::Complex,std::default_delete<duckdb::Complex>,true>>>
      ::emplace_back<duckdb::unique_ptr<duckdb::Complex,std::default_delete<duckdb::Complex>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Complex,std::default_delete<duckdb::Complex>,true>,std::allocator<duckdb::unique_ptr<duckdb::Complex,std::default_delete<duckdb::Complex>,true>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true> *)
                 &local_40);
      _Var2._M_t.super__Tuple_impl<0UL,_duckdb::Complex_*,_std::default_delete<duckdb::Complex>_>.
      super__Head_base<0UL,_duckdb::Complex_*,_false>._M_head_impl =
           local_40._M_t.
           super__Tuple_impl<0UL,_duckdb::Complex_*,_std::default_delete<duckdb::Complex>_>.
           super__Head_base<0UL,_duckdb::Complex_*,_false>._M_head_impl;
      if ((_Tuple_impl<0UL,_duckdb::Complex_*,_std::default_delete<duckdb::Complex>_>)
          local_40._M_t.
          super__Tuple_impl<0UL,_duckdb::Complex_*,_std::default_delete<duckdb::Complex>_>.
          super__Head_base<0UL,_duckdb::Complex_*,_false>._M_head_impl != (Complex *)0x0) {
        pcVar1 = (((string *)
                  ((long)local_40._M_t.
                         super__Tuple_impl<0UL,_duckdb::Complex_*,_std::default_delete<duckdb::Complex>_>
                         .super__Head_base<0UL,_duckdb::Complex_*,_false>._M_head_impl + 8))->
                 _M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar1 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)local_40._M_t.
                      super__Tuple_impl<0UL,_duckdb::Complex_*,_std::default_delete<duckdb::Complex>_>
                      .super__Head_base<0UL,_duckdb::Complex_*,_false>._M_head_impl + 0x18)) {
          operator_delete(pcVar1);
        }
        operator_delete((void *)_Var2._M_t.
                                super__Tuple_impl<0UL,_duckdb::Complex_*,_std::default_delete<duckdb::Complex>_>
                                .super__Head_base<0UL,_duckdb::Complex_*,_false>._M_head_impl);
      }
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  (*this->_vptr_Deserializer[9])(this);
  return __return_storage_ptr__;
}

Assistant:

inline typename std::enable_if<is_vector<T>::value, T>::type Read() {
		using ELEMENT_TYPE = typename is_vector<T>::ELEMENT_TYPE;
		T vec;
		auto size = OnListBegin();
		for (idx_t i = 0; i < size; i++) {
			vec.push_back(Read<ELEMENT_TYPE>());
		}
		OnListEnd();
		return vec;
	}